

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *this,
          GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *old)

{
  long lVar1;
  bool bVar2;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar3;
  QGenericArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  pair<QModelIndex,_QPersistentModelIndex> *in_stack_ffffffffffffff70;
  pair<QModelIndex,_QPersistentModelIndex> *in_stack_ffffffffffffff78;
  QGenericArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_> *in_stack_ffffffffffffff80;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                           in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                 &DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (ppVar3 = data((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                      &stack0xffffffffffffffe0),
       ppVar3 == (pair<QModelIndex,_QPersistentModelIndex> *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_008abeba;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                          in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                  operator->((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x8abdc7);
        begin((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x8abdd6);
        QtPrivate::QGenericArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (pair<QModelIndex,_QPersistentModelIndex> *)
             operator->((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                        &stack0xffffffffffffffe0);
        ppVar3 = begin((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x8abe11
                      );
        begin((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x8abe20);
        QtPrivate::QGenericArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::moveAppend
                  (in_stack_ffffffffffffff80,ppVar3,in_stack_ffffffffffffff70);
      }
    }
    swap((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
         in_stack_ffffffffffffff70,
         (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
           in_stack_ffffffffffffff70,
           (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                       in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity
              ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
               in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
                   in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::reallocate
              ((QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
               in_stack_ffffffffffffff78,(qsizetype)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_008abeba:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }